

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O2

void store_vertical_filter_output_avx2
               (__m256i *res_lo,__m256i *res_hi,__m256i *res_add_const,__m256i *wt,
               __m256i *res_sub_const,__m256i *round_bits_const,uint8_t *pred,
               ConvolveParams *conv_params,int i,int j,int k,int reduce_bits_vert,int p_stride,
               int p_width,int round_bits)

{
  __m256i alVar1;
  CONV_BUF_TYPE *pCVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar10 [32];
  undefined1 auVar14 [32];
  
  alVar1 = *res_hi;
  if (conv_params->is_compound == 0) {
    auVar12 = vpaddd_avx2((undefined1  [32])*res_add_const,(undefined1  [32])*res_lo);
    auVar14 = vpsrad_avx2(auVar12,ZEXT416((uint)reduce_bits_vert));
    auVar12 = vpaddd_avx2((undefined1  [32])*res_add_const,(undefined1  [32])alVar1);
    auVar12 = vpsrad_avx2(auVar12,ZEXT416((uint)reduce_bits_vert));
    auVar12 = vpackssdw_avx2(auVar14,auVar12);
    auVar12 = vpackuswb_avx2(auVar12,auVar12);
    iVar3 = (k + i + 4) * p_stride + j;
    iVar4 = (k + i + 5) * p_stride + j;
    if (p_width == 4) {
      *(int *)(pred + iVar3) = auVar12._0_4_;
      *(int *)(pred + iVar4) = auVar12._16_4_;
    }
    else {
      *(long *)(pred + iVar3) = auVar12._0_8_;
      *(long *)(pred + iVar4) = auVar12._16_8_;
    }
  }
  else {
    pCVar2 = conv_params->dst;
    iVar5 = k + i + 4;
    iVar3 = conv_params->dst_stride * iVar5 + j;
    iVar6 = k + i + 5;
    iVar4 = conv_params->dst_stride * iVar6 + j;
    auVar12 = vpaddd_avx2((undefined1  [32])*res_lo,(undefined1  [32])*res_add_const);
    auVar12 = vpsrad_avx2(auVar12,ZEXT416((uint)reduce_bits_vert));
    auVar12 = vpackusdw_avx2(auVar12,auVar12);
    if (conv_params->do_average == 0) {
      *(long *)(pCVar2 + iVar3) = auVar12._0_8_;
      *(long *)(pCVar2 + iVar4) = auVar12._16_8_;
    }
    else {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)(pCVar2 + iVar4);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *(ulong *)(pCVar2 + iVar3);
      auVar14._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar13;
      auVar14._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar15;
      if (conv_params->use_dist_wtd_comp_avg == 0) {
        auVar12 = vpaddw_avx2(auVar12,auVar14);
        auVar12 = vpsraw_avx2(auVar12,1);
      }
      else {
        auVar12 = vpunpcklwd_avx2(auVar14,auVar12);
        auVar12 = vpmaddwd_avx2(auVar12,(undefined1  [32])*wt);
        auVar12 = vpsrad_avx2(auVar12,4);
        auVar12 = vpackusdw_avx2(auVar12,auVar12);
      }
      auVar12 = vpaddw_avx2(auVar12,(undefined1  [32])*res_sub_const);
      auVar12 = vpaddw_avx2(auVar12,(undefined1  [32])*round_bits_const);
      auVar12 = vpsraw_avx2(auVar12,ZEXT416((uint)round_bits));
      auVar12 = vpackuswb_avx2(auVar12,auVar12);
      *(int *)(pred + (iVar5 * p_stride + j)) = auVar12._0_4_;
      *(int *)(pred + (iVar6 * p_stride + j)) = auVar12._16_4_;
    }
    if (4 < p_width) {
      pCVar2 = conv_params->dst;
      lVar8 = (long)(conv_params->dst_stride * iVar5 + j);
      auVar12 = vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])*res_add_const);
      auVar12 = vpsrad_avx2(auVar12,ZEXT416((uint)reduce_bits_vert));
      lVar7 = (long)(conv_params->dst_stride * iVar6 + j);
      auVar12 = vpackusdw_avx2(auVar12,auVar12);
      if (conv_params->do_average == 0) {
        *(long *)(pCVar2 + lVar8 + 4) = auVar12._0_8_;
        *(long *)(pCVar2 + lVar7 + 4) = auVar12._16_8_;
      }
      else {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)(pCVar2 + lVar7 + 4);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)(pCVar2 + lVar8 + 4);
        auVar10._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar9;
        auVar10._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar11;
        if (conv_params->use_dist_wtd_comp_avg == 0) {
          auVar12 = vpaddw_avx2(auVar12,auVar10);
          auVar12 = vpsraw_avx2(auVar12,1);
        }
        else {
          auVar12 = vpunpcklwd_avx2(auVar10,auVar12);
          auVar12 = vpmaddwd_avx2(auVar12,(undefined1  [32])*wt);
          auVar12 = vpsrad_avx2(auVar12,4);
          auVar12 = vpackusdw_avx2(auVar12,auVar12);
        }
        auVar12 = vpaddw_avx2(auVar12,(undefined1  [32])*res_sub_const);
        auVar12 = vpaddw_avx2(auVar12,(undefined1  [32])*round_bits_const);
        auVar12 = vpsraw_avx2(auVar12,ZEXT416((uint)round_bits));
        auVar12 = vpackuswb_avx2(auVar12,auVar12);
        *(int *)(pred + (long)(iVar5 * p_stride + j) + 4) = auVar12._0_4_;
        *(int *)(pred + (long)(iVar6 * p_stride + j) + 4) = auVar12._16_4_;
      }
    }
  }
  return;
}

Assistant:

static inline void store_vertical_filter_output_avx2(
    const __m256i *res_lo, const __m256i *res_hi, const __m256i *res_add_const,
    const __m256i *wt, const __m256i *res_sub_const,
    const __m256i *round_bits_const, uint8_t *pred, ConvolveParams *conv_params,
    int i, int j, int k, const int reduce_bits_vert, int p_stride, int p_width,
    const int round_bits) {
  __m256i res_lo_1 = *res_lo;
  __m256i res_hi_1 = *res_hi;

  if (conv_params->is_compound) {
    __m128i *const p_0 =
        (__m128i *)&conv_params->dst[(i + k + 4) * conv_params->dst_stride + j];
    __m128i *const p_1 =
        (__m128i *)&conv_params
            ->dst[(i + (k + 1) + 4) * conv_params->dst_stride + j];

    res_lo_1 = _mm256_srai_epi32(_mm256_add_epi32(res_lo_1, *res_add_const),
                                 reduce_bits_vert);

    const __m256i temp_lo_16 = _mm256_packus_epi32(res_lo_1, res_lo_1);
    __m256i res_lo_16;
    if (conv_params->do_average) {
      __m128i *const dst8_0 = (__m128i *)&pred[(i + k + 4) * p_stride + j];
      __m128i *const dst8_1 =
          (__m128i *)&pred[(i + (k + 1) + 4) * p_stride + j];
      const __m128i p_16_0 = _mm_loadl_epi64(p_0);
      const __m128i p_16_1 = _mm_loadl_epi64(p_1);
      const __m256i p_16 =
          _mm256_inserti128_si256(_mm256_castsi128_si256(p_16_0), p_16_1, 1);
      if (conv_params->use_dist_wtd_comp_avg) {
        const __m256i p_16_lo = _mm256_unpacklo_epi16(p_16, temp_lo_16);
        const __m256i wt_res_lo = _mm256_madd_epi16(p_16_lo, *wt);
        const __m256i shifted_32 =
            _mm256_srai_epi32(wt_res_lo, DIST_PRECISION_BITS);
        res_lo_16 = _mm256_packus_epi32(shifted_32, shifted_32);
      } else {
        res_lo_16 = _mm256_srai_epi16(_mm256_add_epi16(p_16, temp_lo_16), 1);
      }
      res_lo_16 = _mm256_add_epi16(res_lo_16, *res_sub_const);
      res_lo_16 = _mm256_srai_epi16(
          _mm256_add_epi16(res_lo_16, *round_bits_const), round_bits);
      const __m256i res_8_lo = _mm256_packus_epi16(res_lo_16, res_lo_16);
      const __m128i res_8_lo_0 = _mm256_castsi256_si128(res_8_lo);
      const __m128i res_8_lo_1 = _mm256_extracti128_si256(res_8_lo, 1);
      *(int *)dst8_0 = _mm_cvtsi128_si32(res_8_lo_0);
      *(int *)dst8_1 = _mm_cvtsi128_si32(res_8_lo_1);
    } else {
      const __m128i temp_lo_16_0 = _mm256_castsi256_si128(temp_lo_16);
      const __m128i temp_lo_16_1 = _mm256_extracti128_si256(temp_lo_16, 1);
      _mm_storel_epi64(p_0, temp_lo_16_0);
      _mm_storel_epi64(p_1, temp_lo_16_1);
    }
    if (p_width > 4) {
      __m128i *const p4_0 =
          (__m128i *)&conv_params
              ->dst[(i + k + 4) * conv_params->dst_stride + j + 4];
      __m128i *const p4_1 =
          (__m128i *)&conv_params
              ->dst[(i + (k + 1) + 4) * conv_params->dst_stride + j + 4];
      res_hi_1 = _mm256_srai_epi32(_mm256_add_epi32(res_hi_1, *res_add_const),
                                   reduce_bits_vert);
      const __m256i temp_hi_16 = _mm256_packus_epi32(res_hi_1, res_hi_1);
      __m256i res_hi_16;
      if (conv_params->do_average) {
        __m128i *const dst8_4_0 =
            (__m128i *)&pred[(i + k + 4) * p_stride + j + 4];
        __m128i *const dst8_4_1 =
            (__m128i *)&pred[(i + (k + 1) + 4) * p_stride + j + 4];
        const __m128i p4_16_0 = _mm_loadl_epi64(p4_0);
        const __m128i p4_16_1 = _mm_loadl_epi64(p4_1);
        const __m256i p4_16 = _mm256_inserti128_si256(
            _mm256_castsi128_si256(p4_16_0), p4_16_1, 1);
        if (conv_params->use_dist_wtd_comp_avg) {
          const __m256i p_16_hi = _mm256_unpacklo_epi16(p4_16, temp_hi_16);
          const __m256i wt_res_hi = _mm256_madd_epi16(p_16_hi, *wt);
          const __m256i shifted_32 =
              _mm256_srai_epi32(wt_res_hi, DIST_PRECISION_BITS);
          res_hi_16 = _mm256_packus_epi32(shifted_32, shifted_32);
        } else {
          res_hi_16 = _mm256_srai_epi16(_mm256_add_epi16(p4_16, temp_hi_16), 1);
        }
        res_hi_16 = _mm256_add_epi16(res_hi_16, *res_sub_const);
        res_hi_16 = _mm256_srai_epi16(
            _mm256_add_epi16(res_hi_16, *round_bits_const), round_bits);
        __m256i res_8_hi = _mm256_packus_epi16(res_hi_16, res_hi_16);
        const __m128i res_8_hi_0 = _mm256_castsi256_si128(res_8_hi);
        const __m128i res_8_hi_1 = _mm256_extracti128_si256(res_8_hi, 1);
        *(int *)dst8_4_0 = _mm_cvtsi128_si32(res_8_hi_0);
        *(int *)dst8_4_1 = _mm_cvtsi128_si32(res_8_hi_1);
      } else {
        const __m128i temp_hi_16_0 = _mm256_castsi256_si128(temp_hi_16);
        const __m128i temp_hi_16_1 = _mm256_extracti128_si256(temp_hi_16, 1);
        _mm_storel_epi64(p4_0, temp_hi_16_0);
        _mm_storel_epi64(p4_1, temp_hi_16_1);
      }
    }
  } else {
    const __m256i res_lo_round = _mm256_srai_epi32(
        _mm256_add_epi32(res_lo_1, *res_add_const), reduce_bits_vert);
    const __m256i res_hi_round = _mm256_srai_epi32(
        _mm256_add_epi32(res_hi_1, *res_add_const), reduce_bits_vert);

    const __m256i res_16bit = _mm256_packs_epi32(res_lo_round, res_hi_round);
    const __m256i res_8bit = _mm256_packus_epi16(res_16bit, res_16bit);
    const __m128i res_8bit0 = _mm256_castsi256_si128(res_8bit);
    const __m128i res_8bit1 = _mm256_extracti128_si256(res_8bit, 1);

    // Store, blending with 'pred' if needed
    __m128i *const p = (__m128i *)&pred[(i + k + 4) * p_stride + j];
    __m128i *const p1 = (__m128i *)&pred[(i + (k + 1) + 4) * p_stride + j];

    if (p_width == 4) {
      *(int *)p = _mm_cvtsi128_si32(res_8bit0);
      *(int *)p1 = _mm_cvtsi128_si32(res_8bit1);
    } else {
      _mm_storel_epi64(p, res_8bit0);
      _mm_storel_epi64(p1, res_8bit1);
    }
  }
}